

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.cpp
# Opt level: O2

void __thiscall
duckdb::DictionaryCompressionCompressState::DictionaryCompressionCompressState
          (DictionaryCompressionCompressState *this,ColumnDataCheckpointData *checkpoint_data_p,
          CompressionInfo *info)

{
  CompressionFunction *pCVar1;
  RowGroup *pRVar2;
  
  (this->super_DictionaryCompressionState).super_CompressionState.info.block_manager =
       info->block_manager;
  (this->super_DictionaryCompressionState).super_CompressionState._vptr_CompressionState =
       (_func_int **)&PTR__DictionaryCompressionCompressState_017a8b38;
  this->checkpoint_data = checkpoint_data_p;
  pCVar1 = ColumnDataCheckpointData::GetCompressionFunction
                     (checkpoint_data_p,COMPRESSION_DICTIONARY);
  this->function = pCVar1;
  (this->current_segment).
  super_unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>._M_t.
  super___uniq_ptr_impl<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::ColumnSegment_*,_std::default_delete<duckdb::ColumnSegment>_>.
  super__Head_base<0UL,_duckdb::ColumnSegment_*,_false>._M_head_impl = (ColumnSegment *)0x0;
  BufferHandle::BufferHandle(&this->current_handle);
  (this->current_string_map)._M_h._M_buckets = &(this->current_string_map)._M_h._M_single_bucket;
  (this->current_string_map)._M_h._M_bucket_count = 1;
  (this->current_string_map)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->current_string_map)._M_h._M_element_count = 0;
  (this->current_string_map)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->current_string_map)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->current_string_map)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->index_buffer).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->index_buffer).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->index_buffer).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->selection_buffer).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->selection_buffer).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->selection_buffer).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->current_width = '\0';
  this->next_width = '\0';
  pRVar2 = ColumnDataCheckpointData::GetRowGroup(this->checkpoint_data);
  CreateEmptySegment(this,(pRVar2->super_SegmentBase<duckdb::RowGroup>).start);
  return;
}

Assistant:

DictionaryCompressionCompressState::DictionaryCompressionCompressState(ColumnDataCheckpointData &checkpoint_data_p,
                                                                       const CompressionInfo &info)
    : DictionaryCompressionState(info), checkpoint_data(checkpoint_data_p),
      function(checkpoint_data.GetCompressionFunction(CompressionType::COMPRESSION_DICTIONARY)) {
	CreateEmptySegment(checkpoint_data.GetRowGroup().start);
}